

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O0

DecodeStatus
DecodeGPR64RegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint Reg_00;
  uint Reg;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint RegNo_local;
  MCInst *Inst_local;
  
  if (RegNo < 0x20) {
    Reg_00 = getReg(Decoder,0x1c,RegNo);
    MCOperand_CreateReg0(Inst,Reg_00);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeGPR64RegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Register;

	if (RegNo > 31)
		return Fail;

	Register = GPR64DecoderTable[RegNo];
	MCOperand_CreateReg0(Inst, Register);
	return Success;
}